

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MorseBondType.hpp
# Opt level: O3

void __thiscall
OpenMD::MorseBondType::calcForce(MorseBondType *this,RealType r,RealType *V,RealType *dVdr)

{
  double dVar1;
  
  dVar1 = exp((r - (this->super_BondType).r0) * -this->beta);
  *V = ((1.0 - (dVar1 + dVar1)) + dVar1 * dVar1) * this->De;
  *dVdr = (dVar1 - dVar1 * dVar1) * (this->De + this->De) * this->beta;
  return;
}

Assistant:

virtual void calcForce(RealType r, RealType& V, RealType& dVdr) {
      RealType dr, eterm, eterm2;

      dr     = r - r0;
      eterm  = exp(-beta * dr);
      eterm2 = eterm * eterm;

      V    = De * (1 - 2.0 * eterm + eterm2);
      dVdr = 2.0 * De * beta * (eterm - eterm2);
    }